

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O2

Literal * __thiscall
wasm::Literal::shrUI16x8(Literal *__return_storage_ptr__,Literal *this,Literal *other)

{
  Type *__return_storage_ptr___00;
  uint uVar1;
  long lVar2;
  Literal *pLVar3;
  undefined1 local_128 [8];
  LaneArray<8> lanes;
  anon_union_16_6_1532cd5a_for_Literal_0 local_50;
  undefined8 local_40;
  Literal *local_38;
  
  local_38 = __return_storage_ptr__;
  if ((other->type).id == 2) {
    getLanes<unsigned_short,8>((LaneArray<8> *)local_128,(wasm *)this,other);
    __return_storage_ptr___00 = &lanes._M_elems[7].type;
    for (lVar2 = 0; pLVar3 = local_38, lVar2 != 0xc0; lVar2 = lVar2 + 0x18) {
      pLVar3 = (Literal *)(local_128 + lVar2);
      uVar1 = geti32(other);
      local_50.i32 = uVar1 & 0xf;
      local_40 = 2;
      shrU((Literal *)__return_storage_ptr___00,pLVar3,(Literal *)&local_50.func);
      if (pLVar3 != (Literal *)__return_storage_ptr___00) {
        ~Literal(pLVar3);
        Literal(pLVar3,(Literal *)__return_storage_ptr___00);
      }
      ~Literal((Literal *)__return_storage_ptr___00);
      ~Literal((Literal *)&local_50.func);
    }
    Literal(local_38,(LaneArray<8> *)local_128);
    std::array<wasm::Literal,_8UL>::~array((array<wasm::Literal,_8UL> *)local_128);
    return pLVar3;
  }
  __assert_fail("shift.type == Type::i32",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/literal.cpp"
                ,0x851,
                "Literal wasm::shift(const Literal &, const Literal &) [Lanes = 8, IntoLanes = &wasm::Literal::getLanesUI16x8, ShiftOp = &wasm::Literal::shrU]"
               );
}

Assistant:

Literal Literal::shrUI16x8(const Literal& other) const {
  return shift<8, &Literal::getLanesUI16x8, &Literal::shrU>(*this, other);
}